

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cinject_test_app.cpp
# Opt level: O0

int main(void)

{
  pointer *this;
  pointer *this_00;
  pointer *this_01;
  pointer *this_02;
  pointer *this_03;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  element_type *peVar4;
  element_type *peVar5;
  element_type *peVar6;
  element_type *peVar7;
  element_type *peVar8;
  element_type *peVar9;
  reference psVar10;
  reference psVar11;
  reference psVar12;
  reference psVar13;
  reference psVar14;
  reference psVar15;
  element_type *peVar16;
  element_type *peVar17;
  element_type *peVar18;
  element_type *peVar19;
  element_type *peVar20;
  element_type *peVar21;
  element_type *this_04;
  element_type *this_05;
  reference psVar22;
  element_type *peVar23;
  element_type *this_06;
  undefined1 local_448 [8];
  shared_ptr<IWaterConsumer> instance_6;
  iterator __end1_6;
  iterator __begin1_6;
  type *__range1_6;
  type waterConsumers;
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [16];
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [16];
  undefined1 local_3b8 [16];
  undefined1 local_3a8 [16];
  undefined1 local_398 [16];
  undefined1 local_388 [16];
  undefined1 local_378 [16];
  undefined1 local_368 [8];
  shared_ptr<IFlyer> instance_5;
  iterator __end1_5;
  iterator __begin1_5;
  type *__range1_5;
  type flyers;
  shared_ptr<ISwimmer> instance_4;
  iterator __end1_4;
  iterator __begin1_4;
  type *__range1_4;
  type swimmers;
  shared_ptr<ICrawler> instance_3;
  iterator __end1_3;
  iterator __begin1_3;
  type *__range1_3;
  type crawlers;
  shared_ptr<IJumper> instance_2;
  iterator __end1_2;
  iterator __begin1_2;
  type *__range1_2;
  type jumpers;
  shared_ptr<IRunner> instance_1;
  iterator __end1_1;
  iterator __begin1_1;
  type *__range1_1;
  type runners;
  shared_ptr<IWalker> instance;
  iterator __end1;
  iterator __begin1;
  type *__range1;
  type walkers;
  shared_ptr<IFlyer> flyer;
  shared_ptr<ISwimmer> swimmer;
  shared_ptr<ICrawler> crawler;
  shared_ptr<IJumper> jumper;
  shared_ptr<IRunner> runner;
  shared_ptr<IWalker> walter;
  undefined1 local_178 [28];
  undefined4 local_15c;
  undefined1 local_158 [8];
  shared_ptr<WaterPool> waterPool;
  function<std::shared_ptr<Behavior>_(cinject::InjectionContext_*)> local_140;
  undefined1 local_120 [8];
  StorageConfiguration<cinject::InstanceStorage<Behavior,_cinject::FunctionFactory<Behavior>_>_>
  local_118;
  ComponentBuilderBase<Wings> local_108;
  StorageConfiguration<cinject::InstanceStorage<Wings,_cinject::ConstructorFactory<Wings,_void>_>_>
  local_100;
  ComponentBuilderBase<Arms> local_f0;
  StorageConfiguration<cinject::InstanceStorage<Arms,_cinject::ConstructorFactory<Arms,_void>_>_>
  local_e8;
  ComponentBuilderBase<Legs> local_d8;
  StorageConfiguration<cinject::InstanceStorage<Legs,_cinject::ConstructorFactory<Legs,_void>_>_>
  local_d0;
  ComponentBuilderBase<IWalker,_IRunner,_IJumper,_IFlyer,_IWaterConsumer,_Bird> local_c0;
  StorageConfiguration<cinject::InstanceStorage<Bird,_cinject::ConstructorFactory<Bird,_void>_>_>
  local_b8;
  ComponentBuilderBase<IWalker,_ICrawler,_ISwimmer,_IWaterConsumer,_Turtle> local_a8;
  StorageConfiguration<cinject::InstanceStorage<Turtle,_cinject::ConstructorFactory<Turtle,_void>_>_>
  local_a0;
  ComponentBuilderBase<ICrawler,_IWaterConsumer,_Snake> local_90;
  StorageConfiguration<cinject::InstanceStorage<Snake,_cinject::ConstructorFactory<Snake,_void>_>_>
  local_88 [2];
  ComponentBuilderBase<IWalker,_IRunner,_IJumper,_ICrawler,_ISwimmer,_IWaterConsumer,_Human>
  local_68;
  StorageConfiguration<cinject::InstanceStorage<Human,_cinject::ConstructorFactory<Human,_void>_>_>
  local_60;
  undefined1 local_50 [8];
  Container c;
  
  c.registrations_._M_h._M_single_bucket._4_4_ = 0;
  cinject::Container::Container((Container *)local_50);
  local_68.container_ =
       (Container *)
       cinject::Container::bind<IWalker,IRunner,IJumper,ICrawler,ISwimmer,IWaterConsumer,Human>
                 ((Container *)local_50);
  cinject::
  ComponentBuilderBase<IWalker,_IRunner,_IJumper,_ICrawler,_ISwimmer,_IWaterConsumer,_Human>::
  to<Human>((ComponentBuilderBase<IWalker,_IRunner,_IJumper,_ICrawler,_ISwimmer,_IWaterConsumer,_Human>
             *)&local_60);
  cinject::
  StorageConfiguration<cinject::InstanceStorage<Human,_cinject::ConstructorFactory<Human,_void>_>_>
  ::inSingletonScope(&local_60);
  cinject::
  StorageConfiguration<cinject::InstanceStorage<Human,_cinject::ConstructorFactory<Human,_void>_>_>
  ::~StorageConfiguration(&local_60);
  local_90.container_ =
       (Container *)cinject::Container::bind<ICrawler,IWaterConsumer,Snake>((Container *)local_50);
  cinject::ComponentBuilderBase<ICrawler,_IWaterConsumer,_Snake>::to<Snake>
            ((ComponentBuilderBase<ICrawler,_IWaterConsumer,_Snake> *)local_88);
  cinject::
  StorageConfiguration<cinject::InstanceStorage<Snake,_cinject::ConstructorFactory<Snake,_void>_>_>
  ::inSingletonScope(local_88);
  cinject::
  StorageConfiguration<cinject::InstanceStorage<Snake,_cinject::ConstructorFactory<Snake,_void>_>_>
  ::~StorageConfiguration(local_88);
  local_a8.container_ =
       (Container *)
       cinject::Container::bind<IWalker,ICrawler,ISwimmer,IWaterConsumer,Turtle>
                 ((Container *)local_50);
  cinject::ComponentBuilderBase<IWalker,_ICrawler,_ISwimmer,_IWaterConsumer,_Turtle>::to<Turtle>
            ((ComponentBuilderBase<IWalker,_ICrawler,_ISwimmer,_IWaterConsumer,_Turtle> *)&local_a0)
  ;
  cinject::
  StorageConfiguration<cinject::InstanceStorage<Turtle,_cinject::ConstructorFactory<Turtle,_void>_>_>
  ::inSingletonScope(&local_a0);
  cinject::
  StorageConfiguration<cinject::InstanceStorage<Turtle,_cinject::ConstructorFactory<Turtle,_void>_>_>
  ::~StorageConfiguration(&local_a0);
  local_c0.container_ =
       (Container *)
       cinject::Container::bind<IWalker,IRunner,IJumper,IFlyer,IWaterConsumer,Bird>
                 ((Container *)local_50);
  cinject::ComponentBuilderBase<IWalker,_IRunner,_IJumper,_IFlyer,_IWaterConsumer,_Bird>::to<Bird>
            ((ComponentBuilderBase<IWalker,_IRunner,_IJumper,_IFlyer,_IWaterConsumer,_Bird> *)
             &local_b8);
  cinject::
  StorageConfiguration<cinject::InstanceStorage<Bird,_cinject::ConstructorFactory<Bird,_void>_>_>::
  inSingletonScope(&local_b8);
  cinject::
  StorageConfiguration<cinject::InstanceStorage<Bird,_cinject::ConstructorFactory<Bird,_void>_>_>::
  ~StorageConfiguration(&local_b8);
  local_d8.container_ = (Container *)cinject::Container::bind<Legs>((Container *)local_50);
  cinject::ComponentBuilder<Legs>::toSelf((ComponentBuilder<Legs> *)&local_d0);
  cinject::
  StorageConfiguration<cinject::InstanceStorage<Legs,_cinject::ConstructorFactory<Legs,_void>_>_>::
  ~StorageConfiguration(&local_d0);
  local_f0.container_ = (Container *)cinject::Container::bind<Arms>((Container *)local_50);
  cinject::ComponentBuilder<Arms>::toSelf((ComponentBuilder<Arms> *)&local_e8);
  cinject::
  StorageConfiguration<cinject::InstanceStorage<Arms,_cinject::ConstructorFactory<Arms,_void>_>_>::
  ~StorageConfiguration(&local_e8);
  local_108.container_ = (Container *)cinject::Container::bind<Wings>((Container *)local_50);
  cinject::ComponentBuilderBase<Wings>::to<Wings>((ComponentBuilderBase<Wings> *)&local_100);
  cinject::
  StorageConfiguration<cinject::InstanceStorage<Wings,_cinject::ConstructorFactory<Wings,_void>_>_>
  ::~StorageConfiguration(&local_100);
  local_120 = (undefined1  [8])cinject::Container::bind<Behavior>((Container *)local_50);
  std::function<std::shared_ptr<Behavior>(cinject::InjectionContext*)>::function<main::__0,void>
            ((function<std::shared_ptr<Behavior>(cinject::InjectionContext*)> *)&local_140,
             (anon_class_1_0_00000001 *)
             ((long)&waterPool.super___shared_ptr<WaterPool,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi + 7));
  cinject::ComponentBuilderBase<Behavior>::toFunction<Behavior>
            ((ComponentBuilderBase<Behavior> *)(local_120 + 8),(FactoryMethodType *)local_120);
  cinject::
  StorageConfiguration<cinject::InstanceStorage<Behavior,_cinject::FunctionFactory<Behavior>_>_>::
  ~StorageConfiguration
            ((StorageConfiguration<cinject::InstanceStorage<Behavior,_cinject::FunctionFactory<Behavior>_>_>
              *)(local_120 + 8));
  std::function<std::shared_ptr<Behavior>_(cinject::InjectionContext_*)>::~function(&local_140);
  local_15c = 1000;
  std::make_shared<WaterPool,int>((int *)local_158);
  local_178._0_8_ = cinject::Container::bind<WaterPool>((Container *)local_50);
  std::shared_ptr<WaterPool>::shared_ptr
            ((shared_ptr<WaterPool> *)
             &walter.super___shared_ptr<IWalker,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (shared_ptr<WaterPool> *)local_158);
  cinject::ComponentBuilderBase<WaterPool>::toConstant<WaterPool>
            ((ComponentBuilderBase<WaterPool> *)(local_178 + 8),(shared_ptr<WaterPool> *)local_178);
  cinject::
  StorageConfiguration<cinject::InstanceStorage<WaterPool,_cinject::ConstantFactory<WaterPool>_>_>::
  ~StorageConfiguration
            ((StorageConfiguration<cinject::InstanceStorage<WaterPool,_cinject::ConstantFactory<WaterPool>_>_>
              *)(local_178 + 8));
  std::shared_ptr<WaterPool>::~shared_ptr
            ((shared_ptr<WaterPool> *)
             &walter.super___shared_ptr<IWalker,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  poVar3 = std::operator<<((ostream *)&std::cout,"Resolving IWalker");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  cinject::Container::get<IWalker>
            ((Container *)
             &runner.super___shared_ptr<IRunner,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (InjectionContext *)local_50);
  peVar4 = std::__shared_ptr_access<IWalker,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<IWalker,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &runner.super___shared_ptr<IRunner,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  (**peVar4->_vptr_IWalker)();
  poVar3 = std::operator<<((ostream *)&std::cout,"Resolving IRunner");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  cinject::Container::get<IRunner>
            ((Container *)
             &jumper.super___shared_ptr<IJumper,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (InjectionContext *)local_50);
  peVar5 = std::__shared_ptr_access<IRunner,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<IRunner,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &jumper.super___shared_ptr<IJumper,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  (**peVar5->_vptr_IRunner)();
  poVar3 = std::operator<<((ostream *)&std::cout,"Resolving IJumper");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  cinject::Container::get<IJumper>
            ((Container *)
             &crawler.super___shared_ptr<ICrawler,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (InjectionContext *)local_50);
  peVar6 = std::__shared_ptr_access<IJumper,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<IJumper,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &crawler.super___shared_ptr<ICrawler,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  (**peVar6->_vptr_IJumper)();
  poVar3 = std::operator<<((ostream *)&std::cout,"Resolving ICrawler");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  cinject::Container::get<ICrawler>
            ((Container *)
             &swimmer.super___shared_ptr<ISwimmer,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (InjectionContext *)local_50);
  peVar7 = std::__shared_ptr_access<ICrawler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<ICrawler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &swimmer.super___shared_ptr<ISwimmer,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  (**peVar7->_vptr_ICrawler)();
  poVar3 = std::operator<<((ostream *)&std::cout,"Resolving ISwimmer");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  cinject::Container::get<ISwimmer>
            ((Container *)&flyer.super___shared_ptr<IFlyer,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (InjectionContext *)local_50);
  peVar8 = std::__shared_ptr_access<ISwimmer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<ISwimmer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &flyer.super___shared_ptr<IFlyer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  (**peVar8->_vptr_ISwimmer)();
  poVar3 = std::operator<<((ostream *)&std::cout,"Resolving IFlyer");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  cinject::Container::get<IFlyer>
            ((Container *)
             &walkers.
              super__Vector_base<std::shared_ptr<IWalker>,_std::allocator<std::shared_ptr<IWalker>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(InjectionContext *)local_50);
  peVar9 = std::__shared_ptr_access<IFlyer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<IFlyer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &walkers.
                       super__Vector_base<std::shared_ptr<IWalker>,_std::allocator<std::shared_ptr<IWalker>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  (**peVar9->_vptr_IFlyer)();
  poVar3 = std::operator<<((ostream *)&std::cout,"Resolving all implementations of IWalker");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  cinject::Container::get<std::vector<IWalker,std::allocator<IWalker>>>
            ((type *)&__range1,(Container *)local_50,(InjectionContext *)0x0);
  __end1 = std::vector<std::shared_ptr<IWalker>,_std::allocator<std::shared_ptr<IWalker>_>_>::begin
                     ((vector<std::shared_ptr<IWalker>,_std::allocator<std::shared_ptr<IWalker>_>_>
                       *)&__range1);
  instance.super___shared_ptr<IWalker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::vector<std::shared_ptr<IWalker>,_std::allocator<std::shared_ptr<IWalker>_>_>::end
                 ((vector<std::shared_ptr<IWalker>,_std::allocator<std::shared_ptr<IWalker>_>_> *)
                  &__range1);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::shared_ptr<IWalker>_*,_std::vector<std::shared_ptr<IWalker>,_std::allocator<std::shared_ptr<IWalker>_>_>_>
                                *)&instance.super___shared_ptr<IWalker,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount);
    if (!bVar1) break;
    psVar10 = __gnu_cxx::
              __normal_iterator<std::shared_ptr<IWalker>_*,_std::vector<std::shared_ptr<IWalker>,_std::allocator<std::shared_ptr<IWalker>_>_>_>
              ::operator*(&__end1);
    this = &runners.
            super__Vector_base<std::shared_ptr<IRunner>,_std::allocator<std::shared_ptr<IRunner>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::shared_ptr<IWalker>::shared_ptr((shared_ptr<IWalker> *)this,psVar10);
    peVar4 = std::__shared_ptr_access<IWalker,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<IWalker,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        this);
    (**peVar4->_vptr_IWalker)();
    std::shared_ptr<IWalker>::~shared_ptr
              ((shared_ptr<IWalker> *)
               &runners.
                super__Vector_base<std::shared_ptr<IRunner>,_std::allocator<std::shared_ptr<IRunner>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<IWalker>_*,_std::vector<std::shared_ptr<IWalker>,_std::allocator<std::shared_ptr<IWalker>_>_>_>
    ::operator++(&__end1);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"Resolving all implementations of IRunner");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  cinject::Container::get<std::vector<IRunner,std::allocator<IRunner>>>
            ((type *)&__range1_1,(Container *)local_50,(InjectionContext *)0x0);
  __end1_1 = std::vector<std::shared_ptr<IRunner>,_std::allocator<std::shared_ptr<IRunner>_>_>::
             begin((vector<std::shared_ptr<IRunner>,_std::allocator<std::shared_ptr<IRunner>_>_> *)
                   &__range1_1);
  instance_1.super___shared_ptr<IRunner,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::vector<std::shared_ptr<IRunner>,_std::allocator<std::shared_ptr<IRunner>_>_>::end
                 ((vector<std::shared_ptr<IRunner>,_std::allocator<std::shared_ptr<IRunner>_>_> *)
                  &__range1_1);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<std::shared_ptr<IRunner>_*,_std::vector<std::shared_ptr<IRunner>,_std::allocator<std::shared_ptr<IRunner>_>_>_>
                        *)&instance_1.super___shared_ptr<IRunner,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount);
    if (!bVar1) break;
    psVar11 = __gnu_cxx::
              __normal_iterator<std::shared_ptr<IRunner>_*,_std::vector<std::shared_ptr<IRunner>,_std::allocator<std::shared_ptr<IRunner>_>_>_>
              ::operator*(&__end1_1);
    this_00 = &jumpers.
               super__Vector_base<std::shared_ptr<IJumper>,_std::allocator<std::shared_ptr<IJumper>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::shared_ptr<IRunner>::shared_ptr((shared_ptr<IRunner> *)this_00,psVar11);
    peVar5 = std::__shared_ptr_access<IRunner,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<IRunner,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        this_00);
    (**peVar5->_vptr_IRunner)();
    std::shared_ptr<IRunner>::~shared_ptr
              ((shared_ptr<IRunner> *)
               &jumpers.
                super__Vector_base<std::shared_ptr<IJumper>,_std::allocator<std::shared_ptr<IJumper>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<IRunner>_*,_std::vector<std::shared_ptr<IRunner>,_std::allocator<std::shared_ptr<IRunner>_>_>_>
    ::operator++(&__end1_1);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"Resolving all implementations of IJumper");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  cinject::Container::get<std::vector<IJumper,std::allocator<IJumper>>>
            ((type *)&__range1_2,(Container *)local_50,(InjectionContext *)0x0);
  __end1_2 = std::vector<std::shared_ptr<IJumper>,_std::allocator<std::shared_ptr<IJumper>_>_>::
             begin((vector<std::shared_ptr<IJumper>,_std::allocator<std::shared_ptr<IJumper>_>_> *)
                   &__range1_2);
  instance_2.super___shared_ptr<IJumper,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::vector<std::shared_ptr<IJumper>,_std::allocator<std::shared_ptr<IJumper>_>_>::end
                 ((vector<std::shared_ptr<IJumper>,_std::allocator<std::shared_ptr<IJumper>_>_> *)
                  &__range1_2);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_2,
                       (__normal_iterator<std::shared_ptr<IJumper>_*,_std::vector<std::shared_ptr<IJumper>,_std::allocator<std::shared_ptr<IJumper>_>_>_>
                        *)&instance_2.super___shared_ptr<IJumper,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount);
    if (!bVar1) break;
    psVar12 = __gnu_cxx::
              __normal_iterator<std::shared_ptr<IJumper>_*,_std::vector<std::shared_ptr<IJumper>,_std::allocator<std::shared_ptr<IJumper>_>_>_>
              ::operator*(&__end1_2);
    this_01 = &crawlers.
               super__Vector_base<std::shared_ptr<ICrawler>,_std::allocator<std::shared_ptr<ICrawler>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::shared_ptr<IJumper>::shared_ptr((shared_ptr<IJumper> *)this_01,psVar12);
    peVar6 = std::__shared_ptr_access<IJumper,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<IJumper,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        this_01);
    (**peVar6->_vptr_IJumper)();
    std::shared_ptr<IJumper>::~shared_ptr
              ((shared_ptr<IJumper> *)
               &crawlers.
                super__Vector_base<std::shared_ptr<ICrawler>,_std::allocator<std::shared_ptr<ICrawler>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<IJumper>_*,_std::vector<std::shared_ptr<IJumper>,_std::allocator<std::shared_ptr<IJumper>_>_>_>
    ::operator++(&__end1_2);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"Resolving all implementations of ICrawler");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  cinject::Container::get<std::vector<ICrawler,std::allocator<ICrawler>>>
            ((type *)&__range1_3,(Container *)local_50,(InjectionContext *)0x0);
  __end1_3 = std::vector<std::shared_ptr<ICrawler>,_std::allocator<std::shared_ptr<ICrawler>_>_>::
             begin((vector<std::shared_ptr<ICrawler>,_std::allocator<std::shared_ptr<ICrawler>_>_> *
                   )&__range1_3);
  instance_3.super___shared_ptr<ICrawler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::vector<std::shared_ptr<ICrawler>,_std::allocator<std::shared_ptr<ICrawler>_>_>::end
                 ((vector<std::shared_ptr<ICrawler>,_std::allocator<std::shared_ptr<ICrawler>_>_> *)
                  &__range1_3);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_3,
                       (__normal_iterator<std::shared_ptr<ICrawler>_*,_std::vector<std::shared_ptr<ICrawler>,_std::allocator<std::shared_ptr<ICrawler>_>_>_>
                        *)&instance_3.super___shared_ptr<ICrawler,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount);
    if (!bVar1) break;
    psVar13 = __gnu_cxx::
              __normal_iterator<std::shared_ptr<ICrawler>_*,_std::vector<std::shared_ptr<ICrawler>,_std::allocator<std::shared_ptr<ICrawler>_>_>_>
              ::operator*(&__end1_3);
    this_02 = &swimmers.
               super__Vector_base<std::shared_ptr<ISwimmer>,_std::allocator<std::shared_ptr<ISwimmer>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::shared_ptr<ICrawler>::shared_ptr((shared_ptr<ICrawler> *)this_02,psVar13);
    peVar7 = std::__shared_ptr_access<ICrawler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ICrawler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        this_02);
    (**peVar7->_vptr_ICrawler)();
    std::shared_ptr<ICrawler>::~shared_ptr
              ((shared_ptr<ICrawler> *)
               &swimmers.
                super__Vector_base<std::shared_ptr<ISwimmer>,_std::allocator<std::shared_ptr<ISwimmer>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<ICrawler>_*,_std::vector<std::shared_ptr<ICrawler>,_std::allocator<std::shared_ptr<ICrawler>_>_>_>
    ::operator++(&__end1_3);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"Resolving all implementations of ISwimmer");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  cinject::Container::get<std::vector<ISwimmer,std::allocator<ISwimmer>>>
            ((type *)&__range1_4,(Container *)local_50,(InjectionContext *)0x0);
  __end1_4 = std::vector<std::shared_ptr<ISwimmer>,_std::allocator<std::shared_ptr<ISwimmer>_>_>::
             begin((vector<std::shared_ptr<ISwimmer>,_std::allocator<std::shared_ptr<ISwimmer>_>_> *
                   )&__range1_4);
  instance_4.super___shared_ptr<ISwimmer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::vector<std::shared_ptr<ISwimmer>,_std::allocator<std::shared_ptr<ISwimmer>_>_>::end
                 ((vector<std::shared_ptr<ISwimmer>,_std::allocator<std::shared_ptr<ISwimmer>_>_> *)
                  &__range1_4);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_4,
                       (__normal_iterator<std::shared_ptr<ISwimmer>_*,_std::vector<std::shared_ptr<ISwimmer>,_std::allocator<std::shared_ptr<ISwimmer>_>_>_>
                        *)&instance_4.super___shared_ptr<ISwimmer,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount);
    if (!bVar1) break;
    psVar14 = __gnu_cxx::
              __normal_iterator<std::shared_ptr<ISwimmer>_*,_std::vector<std::shared_ptr<ISwimmer>,_std::allocator<std::shared_ptr<ISwimmer>_>_>_>
              ::operator*(&__end1_4);
    this_03 = &flyers.
               super__Vector_base<std::shared_ptr<IFlyer>,_std::allocator<std::shared_ptr<IFlyer>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::shared_ptr<ISwimmer>::shared_ptr((shared_ptr<ISwimmer> *)this_03,psVar14);
    peVar8 = std::__shared_ptr_access<ISwimmer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ISwimmer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        this_03);
    (**peVar8->_vptr_ISwimmer)();
    std::shared_ptr<ISwimmer>::~shared_ptr
              ((shared_ptr<ISwimmer> *)
               &flyers.
                super__Vector_base<std::shared_ptr<IFlyer>,_std::allocator<std::shared_ptr<IFlyer>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<ISwimmer>_*,_std::vector<std::shared_ptr<ISwimmer>,_std::allocator<std::shared_ptr<ISwimmer>_>_>_>
    ::operator++(&__end1_4);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"Resolving all implementations of IFlyer");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  cinject::Container::get<std::vector<IFlyer,std::allocator<IFlyer>>>
            ((type *)&__range1_5,(Container *)local_50,(InjectionContext *)0x0);
  __end1_5 = std::vector<std::shared_ptr<IFlyer>,_std::allocator<std::shared_ptr<IFlyer>_>_>::begin
                       ((vector<std::shared_ptr<IFlyer>,_std::allocator<std::shared_ptr<IFlyer>_>_>
                         *)&__range1_5);
  instance_5.super___shared_ptr<IFlyer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::vector<std::shared_ptr<IFlyer>,_std::allocator<std::shared_ptr<IFlyer>_>_>::end
                 ((vector<std::shared_ptr<IFlyer>,_std::allocator<std::shared_ptr<IFlyer>_>_> *)
                  &__range1_5);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_5,
                       (__normal_iterator<std::shared_ptr<IFlyer>_*,_std::vector<std::shared_ptr<IFlyer>,_std::allocator<std::shared_ptr<IFlyer>_>_>_>
                        *)&instance_5.super___shared_ptr<IFlyer,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount);
    if (!bVar1) break;
    psVar15 = __gnu_cxx::
              __normal_iterator<std::shared_ptr<IFlyer>_*,_std::vector<std::shared_ptr<IFlyer>,_std::allocator<std::shared_ptr<IFlyer>_>_>_>
              ::operator*(&__end1_5);
    std::shared_ptr<IFlyer>::shared_ptr((shared_ptr<IFlyer> *)local_368,psVar15);
    peVar9 = std::__shared_ptr_access<IFlyer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<IFlyer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_368);
    (**peVar9->_vptr_IFlyer)();
    std::shared_ptr<IFlyer>::~shared_ptr((shared_ptr<IFlyer> *)local_368);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<IFlyer>_*,_std::vector<std::shared_ptr<IFlyer>,_std::allocator<std::shared_ptr<IFlyer>_>_>_>
    ::operator++(&__end1_5);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"Dumping all entity behavior");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  cinject::Container::get<Human>((Container *)local_378,(InjectionContext *)local_50);
  peVar16 = std::__shared_ptr_access<Human,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Human,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       local_378);
  peVar17 = std::__shared_ptr_access<Behavior,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Behavior,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       &peVar16->behavior);
  Behavior::act(peVar17);
  std::shared_ptr<Human>::~shared_ptr((shared_ptr<Human> *)local_378);
  cinject::Container::get<Snake>((Container *)local_388,(InjectionContext *)local_50);
  peVar18 = std::__shared_ptr_access<Snake,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Snake,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       local_388);
  peVar17 = std::__shared_ptr_access<Behavior,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Behavior,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       &peVar18->behavior);
  Behavior::act(peVar17);
  std::shared_ptr<Snake>::~shared_ptr((shared_ptr<Snake> *)local_388);
  cinject::Container::get<Turtle>((Container *)local_398,(InjectionContext *)local_50);
  peVar19 = std::__shared_ptr_access<Turtle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Turtle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       local_398);
  peVar17 = std::__shared_ptr_access<Behavior,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Behavior,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       &peVar19->behavior);
  Behavior::act(peVar17);
  std::shared_ptr<Turtle>::~shared_ptr((shared_ptr<Turtle> *)local_398);
  cinject::Container::get<Bird>((Container *)local_3a8,(InjectionContext *)local_50);
  peVar20 = std::__shared_ptr_access<Bird,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Bird,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       local_3a8);
  peVar17 = std::__shared_ptr_access<Behavior,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Behavior,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       &peVar20->behavior);
  Behavior::act(peVar17);
  std::shared_ptr<Bird>::~shared_ptr((shared_ptr<Bird> *)local_3a8);
  poVar3 = std::operator<<((ostream *)&std::cout,"Moving with all limbs");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  cinject::Container::get<Human>((Container *)local_3b8,(InjectionContext *)local_50);
  peVar16 = std::__shared_ptr_access<Human,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Human,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       local_3b8);
  peVar21 = std::__shared_ptr_access<Legs,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Legs,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       &peVar16->legs);
  Legs::move(peVar21);
  std::shared_ptr<Human>::~shared_ptr((shared_ptr<Human> *)local_3b8);
  cinject::Container::get<Human>((Container *)local_3c8,(InjectionContext *)local_50);
  peVar16 = std::__shared_ptr_access<Human,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Human,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       local_3c8);
  this_04 = std::__shared_ptr_access<Arms,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Arms,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       &peVar16->arms);
  Arms::move(this_04);
  std::shared_ptr<Human>::~shared_ptr((shared_ptr<Human> *)local_3c8);
  cinject::Container::get<Snake>((Container *)local_3d8,(InjectionContext *)local_50);
  peVar18 = std::__shared_ptr_access<Snake,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Snake,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       local_3d8);
  peVar21 = std::__shared_ptr_access<Legs,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Legs,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       &peVar18->legs);
  Legs::move(peVar21);
  std::shared_ptr<Snake>::~shared_ptr((shared_ptr<Snake> *)local_3d8);
  cinject::Container::get<Turtle>((Container *)local_3e8,(InjectionContext *)local_50);
  peVar19 = std::__shared_ptr_access<Turtle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Turtle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       local_3e8);
  peVar21 = std::__shared_ptr_access<Legs,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Legs,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       &peVar19->legs);
  Legs::move(peVar21);
  std::shared_ptr<Turtle>::~shared_ptr((shared_ptr<Turtle> *)local_3e8);
  cinject::Container::get<Bird>((Container *)local_3f8,(InjectionContext *)local_50);
  peVar20 = std::__shared_ptr_access<Bird,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Bird,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       local_3f8);
  peVar21 = std::__shared_ptr_access<Legs,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Legs,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       &peVar20->legs);
  Legs::move(peVar21);
  std::shared_ptr<Bird>::~shared_ptr((shared_ptr<Bird> *)local_3f8);
  cinject::Container::get<Bird>
            ((Container *)
             &waterConsumers.
              super__Vector_base<std::shared_ptr<IWaterConsumer>,_std::allocator<std::shared_ptr<IWaterConsumer>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(InjectionContext *)local_50);
  peVar20 = std::__shared_ptr_access<Bird,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Bird,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       &waterConsumers.
                        super__Vector_base<std::shared_ptr<IWaterConsumer>,_std::allocator<std::shared_ptr<IWaterConsumer>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  this_05 = std::__shared_ptr_access<Wings,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Wings,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       &peVar20->wings);
  Wings::move(this_05);
  std::shared_ptr<Bird>::~shared_ptr
            ((shared_ptr<Bird> *)
             &waterConsumers.
              super__Vector_base<std::shared_ptr<IWaterConsumer>,_std::allocator<std::shared_ptr<IWaterConsumer>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  poVar3 = std::operator<<((ostream *)&std::cout,"Make all entities consume water");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  cinject::Container::get<std::vector<IWaterConsumer,std::allocator<IWaterConsumer>>>
            ((type *)&__range1_6,(Container *)local_50,(InjectionContext *)0x0);
  __end1_6 = std::
             vector<std::shared_ptr<IWaterConsumer>,_std::allocator<std::shared_ptr<IWaterConsumer>_>_>
             ::begin((vector<std::shared_ptr<IWaterConsumer>,_std::allocator<std::shared_ptr<IWaterConsumer>_>_>
                      *)&__range1_6);
  instance_6.super___shared_ptr<IWaterConsumer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::
       vector<std::shared_ptr<IWaterConsumer>,_std::allocator<std::shared_ptr<IWaterConsumer>_>_>::
       end((vector<std::shared_ptr<IWaterConsumer>,_std::allocator<std::shared_ptr<IWaterConsumer>_>_>
            *)&__range1_6);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_6,
                       (__normal_iterator<std::shared_ptr<IWaterConsumer>_*,_std::vector<std::shared_ptr<IWaterConsumer>,_std::allocator<std::shared_ptr<IWaterConsumer>_>_>_>
                        *)&instance_6.super___shared_ptr<IWaterConsumer,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount);
    if (!bVar1) break;
    psVar22 = __gnu_cxx::
              __normal_iterator<std::shared_ptr<IWaterConsumer>_*,_std::vector<std::shared_ptr<IWaterConsumer>,_std::allocator<std::shared_ptr<IWaterConsumer>_>_>_>
              ::operator*(&__end1_6);
    std::shared_ptr<IWaterConsumer>::shared_ptr((shared_ptr<IWaterConsumer> *)local_448,psVar22);
    peVar23 = std::__shared_ptr_access<IWaterConsumer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<IWaterConsumer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_448);
    (**peVar23->_vptr_IWaterConsumer)();
    std::shared_ptr<IWaterConsumer>::~shared_ptr((shared_ptr<IWaterConsumer> *)local_448);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<IWaterConsumer>_*,_std::vector<std::shared_ptr<IWaterConsumer>,_std::allocator<std::shared_ptr<IWaterConsumer>_>_>_>
    ::operator++(&__end1_6);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"Remaining water in water pool: ");
  this_06 = std::__shared_ptr_access<WaterPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<WaterPool,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       local_158);
  iVar2 = WaterPool::remainingWater(this_06);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  c.registrations_._M_h._M_single_bucket._4_4_ = 0;
  std::vector<std::shared_ptr<IWaterConsumer>,_std::allocator<std::shared_ptr<IWaterConsumer>_>_>::
  ~vector((vector<std::shared_ptr<IWaterConsumer>,_std::allocator<std::shared_ptr<IWaterConsumer>_>_>
           *)&__range1_6);
  std::vector<std::shared_ptr<IFlyer>,_std::allocator<std::shared_ptr<IFlyer>_>_>::~vector
            ((vector<std::shared_ptr<IFlyer>,_std::allocator<std::shared_ptr<IFlyer>_>_> *)
             &__range1_5);
  std::vector<std::shared_ptr<ISwimmer>,_std::allocator<std::shared_ptr<ISwimmer>_>_>::~vector
            ((vector<std::shared_ptr<ISwimmer>,_std::allocator<std::shared_ptr<ISwimmer>_>_> *)
             &__range1_4);
  std::vector<std::shared_ptr<ICrawler>,_std::allocator<std::shared_ptr<ICrawler>_>_>::~vector
            ((vector<std::shared_ptr<ICrawler>,_std::allocator<std::shared_ptr<ICrawler>_>_> *)
             &__range1_3);
  std::vector<std::shared_ptr<IJumper>,_std::allocator<std::shared_ptr<IJumper>_>_>::~vector
            ((vector<std::shared_ptr<IJumper>,_std::allocator<std::shared_ptr<IJumper>_>_> *)
             &__range1_2);
  std::vector<std::shared_ptr<IRunner>,_std::allocator<std::shared_ptr<IRunner>_>_>::~vector
            ((vector<std::shared_ptr<IRunner>,_std::allocator<std::shared_ptr<IRunner>_>_> *)
             &__range1_1);
  std::vector<std::shared_ptr<IWalker>,_std::allocator<std::shared_ptr<IWalker>_>_>::~vector
            ((vector<std::shared_ptr<IWalker>,_std::allocator<std::shared_ptr<IWalker>_>_> *)
             &__range1);
  std::shared_ptr<IFlyer>::~shared_ptr
            ((shared_ptr<IFlyer> *)
             &walkers.
              super__Vector_base<std::shared_ptr<IWalker>,_std::allocator<std::shared_ptr<IWalker>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::shared_ptr<ISwimmer>::~shared_ptr
            ((shared_ptr<ISwimmer> *)
             &flyer.super___shared_ptr<IFlyer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<ICrawler>::~shared_ptr
            ((shared_ptr<ICrawler> *)
             &swimmer.super___shared_ptr<ISwimmer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<IJumper>::~shared_ptr
            ((shared_ptr<IJumper> *)
             &crawler.super___shared_ptr<ICrawler,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<IRunner>::~shared_ptr
            ((shared_ptr<IRunner> *)
             &jumper.super___shared_ptr<IJumper,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<IWalker>::~shared_ptr
            ((shared_ptr<IWalker> *)
             &runner.super___shared_ptr<IRunner,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<WaterPool>::~shared_ptr((shared_ptr<WaterPool> *)local_158);
  cinject::Container::~Container((Container *)local_50);
  return c.registrations_._M_h._M_single_bucket._4_4_;
}

Assistant:

int main()
{
    Container c;

    // Singletons
    c.bind<IWalker, IRunner, IJumper, ICrawler, ISwimmer, IWaterConsumer, Human>().to<Human>().inSingletonScope();
    c.bind<ICrawler, IWaterConsumer, Snake>().to<Snake>().inSingletonScope();
    c.bind<IWalker, ICrawler, ISwimmer, IWaterConsumer, Turtle>().to<Turtle>().inSingletonScope();
    c.bind<IWalker, IRunner, IJumper, IFlyer, IWaterConsumer, Bird>().to<Bird>().inSingletonScope();

    // Not singletons
    c.bind<Legs>().toSelf();
    c.bind<Arms>().toSelf();
    c.bind<Wings>().to<Wings>(); //Same as toSelf

    // Manual creation of object. Not singleton, but it could be by calling InSingleTonScope
    c.bind<Behavior>().toFunction<Behavior>([](InjectionContext* ctx)
    {
        const std::string name = ctx->getRequester().name();
        return std::make_shared<Behavior>(name);
    });

    // Manually created instance
    auto waterPool = std::make_shared<WaterPool>(1000);
    c.bind<WaterPool>().toConstant(waterPool);


    std::cout << "Resolving IWalker" << std::endl;
    std::shared_ptr<IWalker> walter = c.get<IWalker>();
    walter->walk();

    std::cout << "Resolving IRunner" << std::endl;
    std::shared_ptr<IRunner> runner = c.get<IRunner>();
    runner->run();

    std::cout << "Resolving IJumper" << std::endl;
    std::shared_ptr<IJumper> jumper = c.get<IJumper>();
    jumper->jump();

    std::cout << "Resolving ICrawler" << std::endl;
    std::shared_ptr<ICrawler> crawler = c.get<ICrawler>();
    crawler->crawl();

    std::cout << "Resolving ISwimmer" << std::endl;
    std::shared_ptr<ISwimmer> swimmer = c.get<ISwimmer>();
    swimmer->swim();

    std::cout << "Resolving IFlyer" << std::endl;
    std::shared_ptr<IFlyer> flyer = c.get<IFlyer>();
    flyer->fly();




    std::cout << "Resolving all implementations of IWalker" << std::endl;
    auto walkers = c.get<std::vector<IWalker>>();

    for (std::shared_ptr<IWalker> instance : walkers)
    {
        instance->walk();
    }

    std::cout << "Resolving all implementations of IRunner" << std::endl;
    auto runners = c.get<std::vector<IRunner>>();

    for (std::shared_ptr<IRunner> instance : runners)
    {
        instance->run();
    }

    std::cout << "Resolving all implementations of IJumper" << std::endl;
    auto jumpers = c.get<std::vector<IJumper>>();

    for (std::shared_ptr<IJumper> instance : jumpers)
    {
        instance->jump();
    }

    std::cout << "Resolving all implementations of ICrawler" << std::endl;
    auto crawlers = c.get<std::vector<ICrawler>>();

    for (std::shared_ptr<ICrawler> instance : crawlers)
    {
        instance->crawl();
    }

    std::cout << "Resolving all implementations of ISwimmer" << std::endl;
    auto swimmers = c.get<std::vector<ISwimmer>>();

    for (std::shared_ptr<ISwimmer> instance : swimmers)
    {
        instance->swim();
    }

    std::cout << "Resolving all implementations of IFlyer" << std::endl;
    auto flyers = c.get<std::vector<IFlyer>>();

    for (std::shared_ptr<IFlyer> instance : flyers)
    {
        instance->fly();
    }


    std::cout << "Dumping all entity behavior" << std::endl;
    c.get<Human>()->behavior->act();
    c.get<Snake>()->behavior->act();
    c.get<Turtle>()->behavior->act();
    c.get<Bird>()->behavior->act();

    std::cout << "Moving with all limbs" << std::endl;
    c.get<Human>()->legs->move();
    c.get<Human>()->arms->move();
    c.get<Snake>()->legs->move();
    c.get<Turtle>()->legs->move();
    c.get<Bird>()->legs->move();
    c.get<Bird>()->wings->move();


    std::cout << "Make all entities consume water" << std::endl;
    auto waterConsumers = c.get<std::vector<IWaterConsumer>>();

    for (std::shared_ptr<IWaterConsumer> instance : waterConsumers)
    {
        instance->consumeWater();
    }

    std::cout << "Remaining water in water pool: " << waterPool->remainingWater() << std::endl;

    return 0;
}